

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessCoordComponentInvarianceCase::iterate
          (TessCoordComponentInvarianceCase *this)

{
  bool bVar1;
  TessPrimitiveType TVar2;
  RenderContext *pRVar3;
  pointer pVVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int i;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  VertexArrayBinding *in_R9;
  int iVar10;
  pointer pfVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  TestLog *pTVar15;
  float fVar16;
  vector<float,_std::allocator<float>_> tessLevels;
  RandomViewport viewport;
  Result tfResult;
  TFHandler tfHandler;
  Random rnd;
  ostringstream s;
  vector<float,_std::allocator<float>_> local_458;
  TestLog *local_440;
  long local_438;
  deUint32 local_42c;
  Vector<float,_3> *local_428;
  long *local_420;
  long local_418;
  long local_410 [2];
  RandomViewport local_400;
  Result local_3f0;
  Vector<float,_2> local_3d0;
  undefined1 local_3c8 [8];
  _Alloc_hider local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  int local_3a0;
  undefined1 local_398 [16];
  int local_388;
  pointer local_380;
  TransformFeedbackHandler<tcu::Vector<float,_3>_> local_378;
  undefined1 local_328 [8];
  _func_int **local_320;
  long local_318;
  _func_int *local_310 [2];
  int local_300;
  ios_base local_2b0 [264];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_440 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar6 = (*pRVar3->_vptr_RenderContext[4])(pRVar3);
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_400,(RenderTarget *)CONCAT44(extraout_var,iVar6),0x10,0x10,dVar7);
  iVar6 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  local_438 = CONCAT44(extraout_var_00,iVar6);
  deRandom_init((deRandom *)local_328,0x7b);
  local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  iVar6 = 0;
  do {
    iVar10 = 6;
    do {
      fVar16 = deRandom_getFloat((deRandom *)local_328);
      fVar16 = fVar16 * 62.0 + 1.0;
      local_1a8[0]._M_dataplus._M_p._0_4_ = fVar16;
      if (local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_458,
                   (iterator)
                   local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)local_1a8);
      }
      else {
        *local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish = fVar16;
        local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar13 = local_438;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x20);
  local_42c = (((this->m_program).m_ptr)->m_program).m_program;
  (**(code **)(local_438 + 0x1680))();
  (**(code **)(lVar13 + 0x1a00))(local_400.x,local_400.y,local_400.width,local_400.height);
  (**(code **)(lVar13 + 0xfd8))(0x8e72,6);
  lVar13 = 0;
  iVar6 = 0;
  do {
    TVar2 = this->m_primitiveType;
    bVar1 = this->m_usePointMode;
    iVar8 = referencePrimitiveCount
                      (TVar2,this->m_spacing,bVar1,
                       (float *)((long)local_458.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar13),
                       (float *)((long)local_458.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar13 + 8));
    iVar10 = 1;
    if ((bVar1 == false) && (iVar10 = -1, TVar2 < TESSPRIMITIVETYPE_LAST)) {
      iVar10 = *(int *)(&DAT_01c39e30 + (ulong)TVar2 * 4);
    }
    iVar5 = iVar10 * iVar8;
    if (iVar10 * iVar8 < iVar6) {
      iVar5 = iVar6;
    }
    iVar6 = iVar5;
    lVar13 = lVar13 + 0x18;
  } while (lVar13 != 0x300);
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            (&local_378,((this->super_TestCase).m_context)->m_renderCtx,iVar6);
  lVar13 = 0;
  pTVar15 = local_440;
  do {
    iVar6 = (int)in_R9;
    paVar9 = &local_1a8[0].field_2;
    local_328 = (undefined1  [8])pTVar15;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_320,"Testing with tessellation levels: ",0x22);
    local_438 = lVar13;
    Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
              (local_1a8,
               (_anonymous_namespace_ *)
               (local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start + lVar13 * 6),(float *)0x2,
               (int)local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + 8 + (int)lVar13 * 0x18,(float *)&DAT_00000004
               ,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_320,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar9) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
    std::ios_base::~ios_base(local_2b0);
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"in_v_attr","");
    pfVar11 = local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start + lVar13 * 6;
    local_328._0_4_ = 1;
    local_320 = local_310;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,local_1a8[0]._M_dataplus._M_p,
               local_1a8[0]._M_dataplus._M_p + local_1a8[0]._M_string_length);
    local_300 = 0;
    local_3c8._0_4_ = local_328._0_4_;
    local_3c0._M_p = (pointer)&local_3b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3c0,local_320,local_318 + (long)local_320);
    local_3a0 = local_300;
    local_398._0_4_ = VTX_COMP_FLOAT;
    local_398._4_4_ = VTX_COMP_CONVERT_NONE;
    local_398._8_8_ = &DAT_600000001;
    local_388 = 0;
    local_380 = pfVar11;
    if (local_320 != local_310) {
      operator_delete(local_320,(ulong)(local_310[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar9) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    dVar7 = 0;
    if (this->m_usePointMode == false) {
      dVar7 = 0xffffffff;
      if ((ulong)this->m_primitiveType < 3) {
        dVar7 = *(deUint32 *)(&DAT_01c39e3c + (ulong)this->m_primitiveType * 4);
      }
    }
    in_R9 = (VertexArrayBinding *)local_3c8;
    TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
              (&local_3f0,&local_378,local_42c,dVar7,1,in_R9,6);
    if ((int)((ulong)((long)local_3f0.varying.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_3f0.varying.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 < 1) {
      bVar1 = false;
    }
    else {
      lVar13 = 0;
      lVar12 = 0;
      do {
        pVVar4 = local_3f0.varying.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_428 = local_3f0.varying.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar12;
        TVar2 = this->m_primitiveType;
        lVar14 = 0;
        do {
          iVar6 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                            (*(undefined4 *)((long)pVVar4->m_data + lVar14 * 4 + lVar13),this);
          pTVar15 = local_440;
          if ((char)iVar6 == '\0') {
            local_328 = (undefined1  [8])local_440;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_320,"Note: output value at index ",0x1c);
            std::ostream::operator<<((ostringstream *)&local_320,(int)lVar12);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_320," is ",4);
            if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              tcu::operator<<((ostream *)local_1a8,local_428);
              std::__cxx11::stringbuf::str();
            }
            else {
              local_3d0.m_data = *(float (*) [2])local_428->m_data;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              tcu::operator<<((ostream *)local_1a8,&local_3d0);
              std::__cxx11::stringbuf::str();
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_320,(char *)local_420,local_418);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if (local_420 != local_410) {
              operator_delete(local_420,local_410[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
            std::ios_base::~ios_base(local_2b0);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid tessellation coordinate component");
            bVar1 = true;
            goto LAB_0141e44a;
          }
          lVar14 = lVar14 + 1;
        } while ((ulong)(TVar2 == TESSPRIMITIVETYPE_TRIANGLES) + 2 != lVar14);
        lVar12 = lVar12 + 1;
        lVar13 = lVar13 + 0xc;
      } while (lVar12 < (int)((ulong)((long)local_3f0.varying.
                                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_3f0.varying.
                                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                        -0x55555555);
      bVar1 = false;
    }
LAB_0141e44a:
    if (local_3f0.varying.
        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3f0.varying.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_3f0.varying.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3f0.varying.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_p != &local_3b0) {
      operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
    }
    if (bVar1) {
      glu::ObjectWrapper::~ObjectWrapper(&local_378.m_tfPrimQuery.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&local_378.m_tfBuffer.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&local_378.m_tf.super_ObjectWrapper);
      goto LAB_0141e500;
    }
    lVar13 = local_438 + 1;
    if (lVar13 == 0x20) {
      glu::ObjectWrapper::~ObjectWrapper(&local_378.m_tfPrimQuery.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&local_378.m_tfBuffer.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&local_378.m_tf.super_ObjectWrapper);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
LAB_0141e500:
      if (local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_458.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

TessCoordComponentInvarianceCase::IterateResult TessCoordComponentInvarianceCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&				log					= m_testCtx.getLog();
	const RenderContext&	renderCtx			= m_context.getRenderContext();
	const RandomViewport	viewport			(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&	gl					= renderCtx.getFunctions();
	const int				numTessLevelCases	= 32;
	const vector<float>		tessLevels			= genTessLevelCases(numTessLevelCases);
	const deUint32			programGL			= m_program->getProgram();

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, 6);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall = 0;
		for (int i = 0; i < numTessLevelCases; i++)
			maxNumVerticesInDrawCall = de::max(maxNumVerticesInDrawCall, referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &tessLevels[6*i+0], &tessLevels[6*i+2]));

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < numTessLevelCases; tessLevelCaseNdx++)
			{
				log << TestLog::Message << "Testing with tessellation levels: " << tessellationLevelsString(&tessLevels[6*tessLevelCaseNdx+0], &tessLevels[6*tessLevelCaseNdx+2]) << TestLog::EndMessage;

				const glu::VertexArrayBinding bindings[] = { glu::va::Float("in_v_attr", 1, (int)6, 0, &tessLevels[6*tessLevelCaseNdx]) };
				const TFHandler::Result tfResult = tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, m_usePointMode),
																					DE_LENGTH_OF_ARRAY(bindings), &bindings[0], 6);

				for (int vtxNdx = 0; vtxNdx < (int)tfResult.varying.size(); vtxNdx++)
				{
					const Vec3&		vec			= tfResult.varying[vtxNdx];
					const int		numComps	= m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 2;

					for (int compNdx = 0; compNdx < numComps; compNdx++)
					{
						if (!checkTessCoordComponent(vec[compNdx]))
						{
							log << TestLog::Message << "Note: output value at index " << vtxNdx << " is "
													<< (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? de::toString(vec) : de::toString(vec.swizzle(0,1)))
													<< TestLog::EndMessage;
							m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid tessellation coordinate component");
							return STOP;
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}